

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.h
# Opt level: O0

void __thiscall
draco::PointCloud::AddAttributeMetadata
          (PointCloud *this,int32_t att_id,
          unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
          *metadata)

{
  bool bVar1;
  uint32_t att_unique_id_00;
  PointAttribute *this_00;
  pointer this_01;
  pointer this_02;
  GeometryMetadata *in_RDX;
  int32_t att_unique_id;
  undefined4 in_stack_ffffffffffffff98;
  int32_t in_stack_ffffffffffffff9c;
  PointCloud *in_stack_ffffffffffffffa0;
  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
  *in_stack_ffffffffffffffb0;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
                      *)0x11878a);
  if (!bVar1) {
    in_stack_ffffffffffffffb0 =
         (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> *)
         operator_new(0x78);
    GeometryMetadata::GeometryMetadata((GeometryMetadata *)in_stack_ffffffffffffffa0);
    std::unique_ptr<draco::GeometryMetadata,std::default_delete<draco::GeometryMetadata>>::
    unique_ptr<std::default_delete<draco::GeometryMetadata>,void>
              ((unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_> *
               )in_stack_ffffffffffffffa0,
               (pointer)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    std::unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>::
    operator=((unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_> *)
              in_stack_ffffffffffffffa0,
              (unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_> *)
              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    std::unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>::
    ~unique_ptr((unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
                 *)in_stack_ffffffffffffffa0);
  }
  this_00 = attribute(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  att_unique_id_00 = GeometryAttribute::unique_id(&this_00->super_GeometryAttribute);
  this_01 = std::
            unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
            operator->((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                        *)0x11881e);
  AttributeMetadata::set_att_unique_id(this_01,att_unique_id_00);
  this_02 = std::unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
            ::operator->((unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
                          *)0x118838);
  std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
  unique_ptr((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> *
             )this_02,(unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                       *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  GeometryMetadata::AddAttributeMetadata(in_RDX,in_stack_ffffffffffffffb0);
  std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
  ~unique_ptr((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
               *)this_02);
  return;
}

Assistant:

void AddAttributeMetadata(int32_t att_id,
                            std::unique_ptr<AttributeMetadata> metadata) {
    if (!metadata_) {
      metadata_ = std::unique_ptr<GeometryMetadata>(new GeometryMetadata());
    }
    const int32_t att_unique_id = attribute(att_id)->unique_id();
    metadata->set_att_unique_id(att_unique_id);
    metadata_->AddAttributeMetadata(std::move(metadata));
  }